

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lackey.cc
# Opt level: O1

bool __thiscall
gss::innards::Lackey::reduce_initial_bounds(Lackey *this,RestrictRangeFunction *restrict_range)

{
  _Head_base<0UL,_gss::innards::Lackey::Imp_*,_false> _Var1;
  int iVar2;
  int iVar3;
  ostream *this_00;
  long *plVar4;
  istream *piVar5;
  DisobedientLackeyError *pDVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  istream *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  int iVar9;
  string_view n_00;
  string k;
  int n;
  anon_class_24_3_091e47fb delete_one;
  optional<int> p;
  string response;
  int lower;
  string operation;
  string command;
  int upper;
  unique_lock<std::mutex> lock;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  int local_15c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined1 local_138 [8];
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  int local_f4;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  int local_90;
  int local_8c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  RestrictRangeFunction *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  unique_lock<std::mutex> local_40;
  
  local_40._M_device =
       &((this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
         .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>._M_head_impl)->
        external_solver_mutex;
  local_40._M_owns = false;
  local_68 = restrict_range;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  plVar4 = &((this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
             .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>._M_head_impl)->
            number_of_calls;
  *plVar4 = *plVar4 + 1;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"I","");
  this_00 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)
                       &((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
                         .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>._M_head_impl)->
                        send_to,local_d0._M_dataplus._M_p,local_d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(this_00," ",1);
  plVar4 = (long *)std::ostream::operator<<(this_00,0);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  _Var1._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
       .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>._M_head_impl;
  if ((*(byte *)((long)&(_Var1._M_head_impl)->field_0x48 +
                *(long *)(*(long *)&(_Var1._M_head_impl)->send_to + -0x18)) & 5) != 0) {
    pDVar6 = (DisobedientLackeyError *)__cxa_allocate_exception(0x28);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"error giving lackey its orders","");
    DisobedientLackeyError::DisobedientLackeyError(pDVar6,&local_f0);
    __cxa_throw(pDVar6,&DisobedientLackeyError::typeinfo,
                DisobedientLackeyError::~DisobedientLackeyError);
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  piVar5 = std::operator>>((istream *)&(_Var1._M_head_impl)->read_from,(string *)&local_f0);
  if (((((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) &&
      (local_f0._M_string_length == local_d0._M_string_length)) &&
     ((local_f0._M_string_length == 0 ||
      (iVar2 = bcmp(local_f0._M_dataplus._M_p,local_d0._M_dataplus._M_p,local_f0._M_string_length),
      iVar2 == 0)))) {
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    local_118._M_string_length = 0;
    local_118.field_2._M_allocated_capacity =
         local_118.field_2._M_allocated_capacity & 0xffffffffffffff00;
    piVar5 = std::operator>>((istream *)
                             &((this->_imp)._M_t.
                               super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
                               .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>.
                              _M_head_impl)->read_from,(string *)&local_118);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
      pDVar6 = (DisobedientLackeyError *)__cxa_allocate_exception(0x28);
      std::operator+(&local_158,"asked lackey to ",&local_d0);
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_158,", but it gave no T/F");
      local_180._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
      paVar8 = &pbVar7->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p == paVar8) {
        local_180.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_180.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
        local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
      }
      else {
        local_180.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      }
      local_180._M_string_length = pbVar7->_M_string_length;
      (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
      pbVar7->_M_string_length = 0;
      (pbVar7->field_2)._M_local_buf[0] = '\0';
      DisobedientLackeyError::DisobedientLackeyError(pDVar6,&local_180);
      __cxa_throw(pDVar6,&DisobedientLackeyError::typeinfo,
                  DisobedientLackeyError::~DisobedientLackeyError);
    }
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_118,"T");
    if (iVar2 == 0) {
      plVar4 = (long *)std::istream::operator>>
                                 ((istream *)
                                  &((this->_imp)._M_t.
                                    super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
                                    .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>.
                                   _M_head_impl)->read_from,&local_15c);
      if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) != 0) {
        local_90 = iVar2;
        pDVar6 = (DisobedientLackeyError *)__cxa_allocate_exception(0x28);
        std::__cxx11::to_string(&local_b0,local_15c);
        std::operator+(&local_88,"lackey replied with length \'",&local_b0);
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_88,"\' to ");
        local_138 = (undefined1  [8])(pbVar7->_M_dataplus)._M_p;
        paVar8 = &pbVar7->field_2;
        if (local_138 == (undefined1  [8])paVar8) {
          local_128._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_128._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
          local_138 = (undefined1  [8])&local_128;
        }
        else {
          local_128._M_allocated_capacity = paVar8->_M_allocated_capacity;
        }
        local_130 = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        std::operator+(&local_158,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138,&local_d0);
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_158," query");
        local_180._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
        paVar8 = &pbVar7->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p == paVar8) {
          local_180.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_180.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
          local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
        }
        else {
          local_180.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
        }
        local_180._M_string_length = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        DisobedientLackeyError::DisobedientLackeyError(pDVar6,&local_180);
        __cxa_throw(pDVar6,&DisobedientLackeyError::typeinfo,
                    DisobedientLackeyError::~DisobedientLackeyError);
      }
      local_90 = 0;
      if (0 < local_15c) {
        iVar3 = 0;
        local_90 = iVar2;
        do {
          local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
          local_180._M_string_length = 0;
          local_180.field_2._M_allocated_capacity =
               local_180.field_2._M_allocated_capacity & 0xffffffffffffff00;
          piVar5 = std::operator>>((istream *)
                                   &((this->_imp)._M_t.
                                     super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
                                     .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>.
                                    _M_head_impl)->read_from,(string *)&local_180);
          this_01 = (istream *)std::istream::operator>>((istream *)piVar5,&local_f4);
          plVar4 = (long *)std::istream::operator>>(this_01,&local_8c);
          if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) != 0) {
            pDVar6 = (DisobedientLackeyError *)__cxa_allocate_exception(0x28);
            std::__cxx11::to_string(&local_60,iVar3);
            std::operator+(&local_b0,"lackey gave bad response triple ",&local_60);
            pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_b0," to ");
            local_88._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
            paVar8 = &pbVar7->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p == paVar8) {
              local_88.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
              local_88.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
              local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
            }
            else {
              local_88.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            }
            local_88._M_string_length = pbVar7->_M_string_length;
            (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
            pbVar7->_M_string_length = 0;
            (pbVar7->field_2)._M_local_buf[0] = '\0';
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_138,&local_88,&local_d0);
            pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_138," query");
            local_158._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
            paVar8 = &pbVar7->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p == paVar8) {
              local_158.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
              local_158.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
              local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
            }
            else {
              local_158.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            }
            local_158._M_string_length = pbVar7->_M_string_length;
            (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
            pbVar7->_M_string_length = 0;
            (pbVar7->field_2)._M_local_buf[0] = '\0';
            DisobedientLackeyError::DisobedientLackeyError(pDVar6,&local_158);
            __cxa_throw(pDVar6,&DisobedientLackeyError::typeinfo,
                        DisobedientLackeyError::~DisobedientLackeyError);
          }
          n_00._M_str = local_180._M_dataplus._M_p;
          n_00._M_len = local_180._M_string_length;
          local_138 = (undefined1  [8])
                      InputGraph::vertex_from_name
                                (((this->_imp)._M_t.
                                  super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
                                  .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>.
                                 _M_head_impl)->pattern_graph,n_00);
          if (local_138[4] == true) {
            local_158._M_string_length = (size_type)local_68;
            local_158.field_2._M_allocated_capacity = (size_type)local_138;
            iVar2 = local_8c;
            local_158._M_dataplus._M_p = (pointer)this;
            if (1 < local_f4) {
              iVar9 = 1;
              do {
                reduce_initial_bounds::anon_class_24_3_091e47fb::operator()
                          ((anon_class_24_3_091e47fb *)&local_158,iVar9);
                iVar9 = iVar9 + 1;
                iVar2 = local_8c;
              } while (iVar9 < local_f4);
            }
            while( true ) {
              iVar2 = iVar2 + 1;
              iVar9 = InputGraph::size(((this->_imp)._M_t.
                                        super___uniq_ptr_impl<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_gss::innards::Lackey::Imp_*,_std::default_delete<gss::innards::Lackey::Imp>_>
                                        .super__Head_base<0UL,_gss::innards::Lackey::Imp_*,_false>.
                                       _M_head_impl)->target_graph);
              if (iVar9 <= iVar2) break;
              reduce_initial_bounds::anon_class_24_3_091e47fb::operator()
                        ((anon_class_24_3_091e47fb *)&local_158,iVar2);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
            operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
          }
          iVar3 = iVar3 + 1;
          iVar2 = local_90;
        } while (iVar3 < local_15c);
      }
    }
    else {
      iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_118,"F");
      if (iVar3 != 0) {
        pDVar6 = (DisobedientLackeyError *)__cxa_allocate_exception(0x28);
        std::operator+(&local_60,"asked lackey to ",&local_d0);
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_60," but it replied with \'");
        local_b0._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
        paVar8 = &pbVar7->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p == paVar8) {
          local_b0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        }
        else {
          local_b0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
        }
        local_b0._M_string_length = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        std::operator+(&local_88,&local_b0,&local_f0);
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_88,"\' then \'");
        local_138 = (undefined1  [8])(pbVar7->_M_dataplus)._M_p;
        paVar8 = &pbVar7->field_2;
        if (local_138 == (undefined1  [8])paVar8) {
          local_128._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_128._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
          local_138 = (undefined1  [8])&local_128;
        }
        else {
          local_128._M_allocated_capacity = paVar8->_M_allocated_capacity;
        }
        local_130 = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        std::operator+(&local_158,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138,&local_118);
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_158,"\'");
        local_180._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
        paVar8 = &pbVar7->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p == paVar8) {
          local_180.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_180.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
          local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
        }
        else {
          local_180.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
        }
        local_180._M_string_length = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        DisobedientLackeyError::DisobedientLackeyError(pDVar6,&local_180);
        __cxa_throw(pDVar6,&DisobedientLackeyError::typeinfo,
                    DisobedientLackeyError::~DisobedientLackeyError);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,
                      CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                               local_f0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_40);
    return iVar2 == 0;
  }
  pDVar6 = (DisobedientLackeyError *)__cxa_allocate_exception(0x28);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                 "asked lackey to ",&local_d0);
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138
                      ,", but it replied with \'");
  local_158._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
  paVar8 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p == paVar8) {
    local_158.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_158.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  }
  else {
    local_158.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_158._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  std::operator+(&local_180,&local_158,&local_f0);
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_180,"\'");
  local_118._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
  paVar8 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p == paVar8) {
    local_118.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_118.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  }
  else {
    local_118.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_118._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  DisobedientLackeyError::DisobedientLackeyError(pDVar6,&local_118);
  __cxa_throw(pDVar6,&DisobedientLackeyError::typeinfo,
              DisobedientLackeyError::~DisobedientLackeyError);
}

Assistant:

auto Lackey::reduce_initial_bounds(
    const RestrictRangeFunction & restrict_range) -> bool
{
    unique_lock<mutex> lock{_imp->external_solver_mutex};
    ++_imp->number_of_calls;

    string command = "I";
    _imp->send_to << command << " " << 0 << endl;

    if (! _imp->send_to)
        throw DisobedientLackeyError{"error giving lackey its orders"};

    string operation;
    if (! (_imp->read_from >> operation) || operation != command)
        throw DisobedientLackeyError{"asked lackey to " + command + ", but it replied with '" + operation + "'"};

    string response;
    if (! (_imp->read_from >> response))
        throw DisobedientLackeyError{"asked lackey to " + command + ", but it gave no T/F"};
    else if (response == "T") {
        /* nothing */
    }
    else if (response == "F")
        return false;
    else
        throw DisobedientLackeyError{"asked lackey to " + command + " but it replied with '" + operation + "' then '" + response + "'"};

    int n;
    if (! (_imp->read_from >> n))
        throw DisobedientLackeyError{"lackey replied with length '" + to_string(n) + "' to " + command + " query"};

    for (int i = 0; i < n; ++i) {
        string k;
        int lower, upper;
        if (! (_imp->read_from >> k >> lower >> upper))
            throw DisobedientLackeyError{"lackey gave bad response triple " + to_string(i) + " to " + command + " query"};
        auto p = _imp->pattern_graph.vertex_from_name(k);
        if (p) {
            auto delete_one = [&](int v) {
                auto v_name = _imp->target_graph.vertex_from_name(to_string(v));
                if (v_name)
                    restrict_range(*p, *v_name);
            };

            for (int i = 1; i < lower; ++i)
                delete_one(i);
            for (int i = upper + 1; i < _imp->target_graph.size(); ++i)
                delete_one(i);
        }
    }

    return true;
}